

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengineex.cpp
# Opt level: O0

void __thiscall QPaintEngineExPrivate::replayClipOperations(QPaintEngineExPrivate *this)

{
  bool bVar1;
  QPaintEngineEx *this_00;
  QPainter *pQVar2;
  QPainterState *pQVar3;
  QPainterClipInfo *pQVar4;
  QPaintEngineExPrivate *in_RDI;
  long in_FS_OFFSET;
  qreal qVar5;
  double dVar6;
  double dVar7;
  qreal bottom;
  qreal right;
  QPainterClipInfo *info;
  QList<QPainterClipInfo> *__range1;
  QList<QPainterClipInfo> *clipInfo;
  QPainter *p;
  QPaintEngineEx *q;
  QVectorPath vp;
  const_iterator __end1;
  const_iterator __begin1;
  qreal pts [8];
  QTransform transform;
  QTransform *in_stack_fffffffffffffea8;
  QPaintEngine *in_stack_fffffffffffffeb0;
  QVectorPath *in_stack_fffffffffffffec0;
  QVectorPath local_f0;
  QPainterClipInfo *local_b0;
  const_iterator local_a8;
  const_iterator local_a0;
  qreal local_98;
  qreal local_90;
  double local_88;
  qreal local_80;
  double local_78;
  double local_70;
  qreal local_68;
  double local_60;
  undefined1 local_58 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = q_func(in_RDI);
  pQVar2 = QPaintEngine::painter(in_stack_fffffffffffffeb0);
  if ((pQVar2 != (QPainter *)0x0) &&
     (bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<QPainterPrivate,_std::default_delete<QPainterPrivate>_> *)
                         0x585751), bVar1)) {
    std::unique_ptr<QPainterPrivate,_std::default_delete<QPainterPrivate>_>::operator->
              ((unique_ptr<QPainterPrivate,_std::default_delete<QPainterPrivate>_> *)0x585773);
    std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::operator->
              ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)0x58577f);
    memcpy(local_58,&DAT_00bbe440,0x50);
    pQVar3 = QPaintEngineEx::state(this_00);
    memcpy(local_58,&pQVar3->matrix,0x50);
    local_a0.i = (QPainterClipInfo *)&DAT_aaaaaaaaaaaaaaaa;
    local_a0 = QList<QPainterClipInfo>::begin((QList<QPainterClipInfo> *)in_stack_fffffffffffffeb0);
    local_a8.i = (QPainterClipInfo *)&DAT_aaaaaaaaaaaaaaaa;
    local_a8 = QList<QPainterClipInfo>::end((QList<QPainterClipInfo> *)in_stack_fffffffffffffeb0);
    while( true ) {
      local_b0 = local_a8.i;
      bVar1 = QList<QPainterClipInfo>::const_iterator::operator!=(&local_a0,local_a8);
      if (!bVar1) break;
      pQVar4 = QList<QPainterClipInfo>::const_iterator::operator*(&local_a0);
      QPaintEngineEx::state(this_00);
      bVar1 = QTransform::operator!=
                        ((QTransform *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      if (bVar1) {
        in_stack_fffffffffffffec0 = (QVectorPath *)&pQVar4->matrix;
        pQVar3 = QPaintEngineEx::state(this_00);
        memcpy(&pQVar3->matrix,in_stack_fffffffffffffec0,0x4a);
        (*(this_00->super_QPaintEngine)._vptr_QPaintEngine[0x27])();
      }
      switch(pQVar4->clipType) {
      case RegionClip:
        (*(this_00->super_QPaintEngine)._vptr_QPaintEngine[0x1e])
                  (this_00,&pQVar4->region,(ulong)pQVar4->operation);
        break;
      case PathClip:
        (*(this_00->super_QPaintEngine)._vptr_QPaintEngine[0x1f])
                  (this_00,&pQVar4->path,(ulong)pQVar4->operation);
        break;
      case RectClip:
        (*(this_00->super_QPaintEngine)._vptr_QPaintEngine[0x1d])
                  (this_00,&pQVar4->rect,(ulong)pQVar4->operation);
        break;
      case RectFClip:
        in_stack_fffffffffffffea8 = (QTransform *)QRectF::x(&pQVar4->rectf);
        qVar5 = QRectF::width(&pQVar4->rectf);
        dVar6 = (double)in_stack_fffffffffffffea8 + qVar5;
        in_stack_fffffffffffffeb0 = (QPaintEngine *)QRectF::y(&pQVar4->rectf);
        qVar5 = QRectF::height(&pQVar4->rectf);
        dVar7 = (double)in_stack_fffffffffffffeb0 + qVar5;
        memset(&local_98,0xff,0x40);
        local_98 = QRectF::x(&pQVar4->rectf);
        local_90 = QRectF::y(&pQVar4->rectf);
        local_88 = dVar6;
        local_80 = QRectF::y(&pQVar4->rectf);
        local_78 = dVar6;
        local_70 = dVar7;
        local_68 = QRectF::x(&pQVar4->rectf);
        local_60 = dVar7;
        memcpy(&local_f0,&DAT_00bbe490,0x40);
        QVectorPath::QVectorPath(&local_f0,&local_98,4,(ElementType *)0x0,0x11);
        (*(this_00->super_QPaintEngine)._vptr_QPaintEngine[0x1c])
                  (this_00,&local_f0,(ulong)pQVar4->operation);
        QVectorPath::~QVectorPath(in_stack_fffffffffffffec0);
      }
      QList<QPainterClipInfo>::const_iterator::operator++(&local_a0);
    }
    QPaintEngineEx::state(this_00);
    bVar1 = QTransform::operator!=
                      ((QTransform *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    if (bVar1) {
      pQVar3 = QPaintEngineEx::state(this_00);
      memcpy(&pQVar3->matrix,local_58,0x4a);
      (*(this_00->super_QPaintEngine)._vptr_QPaintEngine[0x27])();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPaintEngineExPrivate::replayClipOperations()
{
    Q_Q(QPaintEngineEx);

    QPainter *p = q->painter();
    if (!p || !p->d_ptr)
        return;

    const QList<QPainterClipInfo> &clipInfo = p->d_ptr->state->clipInfo;

    QTransform transform = q->state()->matrix;

    for (const QPainterClipInfo &info : clipInfo) {

        if (info.matrix != q->state()->matrix) {
            q->state()->matrix = info.matrix;
            q->transformChanged();
        }

        switch (info.clipType) {
        case QPainterClipInfo::RegionClip:
            q->clip(info.region, info.operation);
            break;
        case QPainterClipInfo::PathClip:
            q->clip(info.path, info.operation);
            break;
        case QPainterClipInfo::RectClip:
            q->clip(info.rect, info.operation);
            break;
        case QPainterClipInfo::RectFClip: {
            qreal right = info.rectf.x() + info.rectf.width();
            qreal bottom = info.rectf.y() + info.rectf.height();
            qreal pts[] = { info.rectf.x(), info.rectf.y(),
                            right, info.rectf.y(),
                            right, bottom,
                            info.rectf.x(), bottom };
            QVectorPath vp(pts, 4, nullptr, QVectorPath::RectangleHint);
            q->clip(vp, info.operation);
            break;
            }
        }
    }

    if (transform != q->state()->matrix) {
        q->state()->matrix = transform;
        q->transformChanged();
    }
}